

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

int __thiscall minihttp::TcpSocket::open(TcpSocket *this,char *__file,int __oflag,...)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  addrinfo *__ai;
  bool bVar4;
  char port_str [16];
  addrinfo hnt;
  addrinfo *local_80;
  sockaddr local_78;
  char local_68 [16];
  addrinfo local_58;
  
  if (this->_s != -1) {
    pcVar3 = __file;
    if (__file == (char *)0x0) {
LAB_00106fd2:
      iVar2 = (int)pcVar3;
      iVar1 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
      if (__oflag == 0) {
        return iVar1;
      }
      if (this->_lastport == __oflag) {
        return iVar1;
      }
    }
    else {
      in_RAX = std::__cxx11::string::compare((char *)&this->_host);
      iVar2 = (int)pcVar3;
      if ((int)in_RAX == 0) goto LAB_00106fd2;
    }
    close(this,iVar2);
  }
  if (__file == (char *)0x0) {
    __file = (this->_host)._M_dataplus._M_p;
  }
  else {
    pcVar3 = (char *)(this->_host)._M_string_length;
    strlen(__file);
    std::__cxx11::string::_M_replace((ulong)&this->_host,0,pcVar3,(ulong)__file);
  }
  if (__oflag == 0) {
    __oflag = this->_lastport;
    if (__oflag == 0) {
      return 0;
    }
  }
  else {
    this->_lastport = __oflag;
  }
  if (this->_s != -1) {
    __assert_fail("!SOCKETVALID(_s)",
                  "/workspace/llm4binary/github/license_c_cmakelists/fgenesis[P]minihttp/minihttp.cpp"
                  ,0x204,"bool minihttp::TcpSocket::open(const char *, unsigned int)");
  }
  this->_recvSize = 0;
  sprintf(local_68,"%u",(ulong)(uint)__oflag);
  local_80 = (addrinfo *)0x0;
  local_58.ai_flags = 0;
  local_58.ai_protocol = 0;
  local_58.ai_addrlen = 0;
  local_58._20_4_ = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  local_58.ai_family = 2;
  local_58.ai_socktype = 1;
  iVar2 = getaddrinfo(__file,local_68,&local_58,&local_80);
  __ai = local_80;
  if ((iVar2 == 0) && (__file = (char *)__ai, local_80 != (addrinfo *)0x0)) {
    if (local_80->ai_family == 2) {
      memcpy(&local_78,local_80->ai_addr,(ulong)local_80->ai_addrlen);
      freeaddrinfo(__ai);
      bVar4 = false;
      iVar2 = socket(2,1,0);
      if (iVar2 != -1) {
        __ai = (addrinfo *)(long)iVar2;
        iVar2 = connect(iVar2,&local_78,0x10);
        bVar4 = iVar2 == 0;
      }
      goto LAB_00107096;
    }
    freeaddrinfo(local_80);
  }
  __ai = (addrinfo *)__file;
  bVar4 = false;
LAB_00107096:
  if (!bVar4) {
    return 0;
  }
  this->_s = (long)__ai;
  _SetNonBlocking((SOCKET)__ai,this->_nonblocking);
  iVar2 = (*this->_vptr_TcpSocket[7])(this);
  return (int)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
}

Assistant:

bool TcpSocket::open(const char *host /* = NULL */, unsigned int port /* = 0 */)
{
    if(isOpen())
    {
        if( (host && host != _host) || (port && port != _lastport) )
            close();
            // ... and continue connecting to new host/port
        else
            return true; // still connected, to same host and port.
    }

    if(host)
        _host = host;
    else
        host = _host.c_str();

    if(port)
        _lastport = port;
    else
    {
        port = _lastport;
        if(!port)
            return false;
    }

    traceprint("TcpSocket::open(): host = [%s], port = %d\n", host, port);

    assert(!SOCKETVALID(_s));

    _recvSize = 0;

    {
        SOCKET s;
        if(!_openSocket(&s, host, port))
            return false;
        _s = s;

#ifdef SO_NOSIGPIPE
        // Don't fire SIGPIPE when trying to write to a closed socket
        {
            int set = 1;
            setsockopt(s, SOL_SOCKET, SO_NOSIGPIPE, (void *)&set, sizeof(int));
        }
#endif

    }

    _SetNonBlocking(_s, _nonblocking); // restore setting if it was set in invalid state. static call because _s is intentionally still invalid here.

#ifdef MINIHTTP_USE_MBEDTLS
    if(_sslctx)
    {
        traceprint("TcpSocket::open(): SSL requested...\n");
        if(!_openSSL(&_s, (SSLCtx*)_sslctx))
        {
            close();
            return false;
        }
    }
#endif

    _OnOpen();

    return true;
}